

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

constructor class_constructor(klass cls,type_id *args,size_t size)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  constructor pcVar4;
  size_t position;
  
  if (cls == (klass)0x0) {
    pcVar4 = (constructor)0x0;
  }
  else {
    sVar2 = vector_size(cls->constructors);
    if (sVar2 == 0) {
      pcVar4 = (constructor)0x0;
      log_write_impl_va("metacall",0x260,"class_constructor",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Class %s does not have any constructor",cls->name);
    }
    else {
      if (sVar2 != 1) {
        position = 0;
        do {
          puVar3 = (undefined8 *)vector_at(cls->constructors,position);
          pcVar4 = (constructor)*puVar3;
          iVar1 = constructor_compare(pcVar4,args,size);
          if (iVar1 == 0) {
            return pcVar4;
          }
          position = position + 1;
        } while (sVar2 != position);
      }
      puVar3 = (undefined8 *)vector_at(cls->constructors,0);
      pcVar4 = (constructor)*puVar3;
    }
  }
  return pcVar4;
}

Assistant:

constructor class_constructor(klass cls, type_id args[], size_t size)
{
	/* This method tries to find a valid constructor with correct types,
	* if this cannot be achieved, we return the default constructor and
	* we let the loader handle the new invokation with variadic arguments */
	if (cls == NULL)
	{
		return NULL;
	}

	size_t iterator, constructor_size = vector_size(cls->constructors);

	if (constructor_size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Class %s does not have any constructor", cls->name);
		return NULL;
	}
	else if (constructor_size == 1)
	{
		return vector_at_type(cls->constructors, 0, constructor);
	}

	for (iterator = 0; iterator < constructor_size; ++iterator)
	{
		constructor ctor = vector_at_type(cls->constructors, iterator, constructor);

		if (constructor_compare(ctor, args, size) == 0)
		{
			return ctor;
		}
	}

	/* Return default constructor if there is not a match */
	return vector_at_type(cls->constructors, 0, constructor);
}